

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.h
# Opt level: O3

void __thiscall
MinVR::VRDataIndex::_setValueSpecialized(VRDataIndex *this,VRDatumPtr *p,VRFloatArray *value)

{
  VRDatumSpecialized<std::vector<float,_std::allocator<float>_>,_(MinVR::VRCORETYPE_ID)5> *this_00;
  vector<float,_std::allocator<float>_> local_30;
  
  this_00 = (VRDatumSpecialized<std::vector<float,_std::allocator<float>_>,_(MinVR::VRCORETYPE_ID)5>
             *)VRDatumPtr::floatArrayVal(p);
  std::vector<float,_std::allocator<float>_>::vector(&local_30,value);
  VRDatumSpecialized<std::vector<float,_std::allocator<float>_>,_(MinVR::VRCORETYPE_ID)5>::setValue
            (this_00,&local_30);
  if (local_30.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void _setValueSpecialized(VRDatumPtr p, VRFloatArray value) {
    p.floatArrayVal()->setValue(value);
  }